

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Fx_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nNewNodesMax,int LitCountMax,int fCanonDivs,
                  int fVerbose,int fVeryVerbose)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *p;
  Vec_Que_t *pVVar2;
  int *piVar3;
  int *piVar4;
  Vec_Wec_t *p_00;
  Vec_Flt_t *pVVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  abctime aVar10;
  Fx_Man_t *p_01;
  abctime aVar11;
  Vec_Int_t *pVVar12;
  void *__ptr;
  long lVar13;
  int *fWarning;
  int *extraout_RDX;
  int *extraout_RDX_00;
  uint uVar14;
  int iVar15;
  int iVar16;
  int i;
  bool bVar17;
  float fVar18;
  
  aVar10 = Abc_Clock();
  p_01 = Fx_ManStart(vCubes);
  p_01->LitCountMax = LitCountMax;
  p_01->fCanonDivs = fCanonDivs;
  Fx_ManCreateLiterals(p_01,ObjIdMax);
  Fx_ManComputeLevel(p_01);
  Fx_ManCreateDivisors(p_01);
  if ((fVeryVerbose != 0) && (p = p_01->vLits, p->nSize < 0x36)) {
    iVar16 = 0;
    printf("         ");
    iVar7 = p->nSize / 2;
    iVar15 = 0x1a;
    if (iVar7 < 0x1a) {
      iVar15 = iVar7;
    }
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    while (bVar17 = iVar15 != 0, iVar15 = iVar15 + -1, bVar17) {
      putchar(iVar16 + 0x61);
      iVar16 = iVar16 + 1;
    }
    putchar(10);
    __ptr = calloc((long)(iVar7 + 1),1);
    p_00 = p_01->vCubes;
    for (uVar14 = 0; (int)uVar14 < p_00->nSize; uVar14 = uVar14 + 1) {
      pVVar12 = Vec_WecEntry(p_00,uVar14);
      if (pVVar12->nSize != 0) {
        memset(__ptr,0x2d,(long)iVar7);
        for (iVar15 = 1; iVar15 < pVVar12->nSize; iVar15 = iVar15 + 1) {
          iVar16 = Vec_IntEntry(pVVar12,iVar15);
          iVar8 = Abc_Lit2Var(iVar16);
          if (iVar7 <= iVar8) {
            __assert_fail("Abc_Lit2Var(Lit) < nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                          ,0x20a,"void Fx_PrintMatrix(Fx_Man_t *)");
          }
          iVar8 = Abc_LitIsCompl(iVar16);
          uVar9 = Abc_Lit2Var(iVar16);
          *(byte *)((long)__ptr + (ulong)uVar9) = iVar8 == 0 | 0x30;
        }
        uVar9 = Vec_IntEntry(pVVar12,0);
        printf("%6d : %s %4d\n",(ulong)uVar14,__ptr,(ulong)uVar9);
      }
    }
    free(__ptr);
    for (iVar15 = 0; iVar15 < p->nSize; iVar15 = iVar15 + 1) {
      pVVar12 = Vec_WecEntry(p,iVar15);
      cVar6 = Fx_PrintDivLit(iVar15);
      printf("%c : ",(ulong)(uint)(int)cVar6);
      printf("Vector has %d entries: {",(ulong)(uint)pVVar12->nSize);
      for (iVar7 = 0; iVar7 < pVVar12->nSize; iVar7 = iVar7 + 1) {
        uVar14 = Vec_IntEntry(pVVar12,iVar7);
        printf(" %d",(ulong)uVar14);
      }
      puts(" }");
    }
    pVVar5 = p_01->vWeights;
    for (iVar15 = 0; iVar15 < pVVar5->nSize; iVar15 = iVar15 + 1) {
      Fx_PrintDiv(p_01,iVar15);
    }
  }
  if (fVerbose != 0) {
    aVar11 = Abc_Clock();
    Fx_PrintStats(p_01,aVar11 - aVar10);
  }
  aVar11 = Abc_Clock();
  p_01->timeStart = aVar11;
  iVar15 = 0;
  if (0 < nNewNodesMax) {
    iVar15 = nNewNodesMax;
  }
  while (bVar17 = iVar15 != 0, iVar15 = iVar15 + -1, bVar17) {
    pVVar2 = p_01->vPrio;
    iVar7 = Vec_QueSize(pVVar2);
    if (iVar7 == 0) break;
    if (*pVVar2->pCostsFlt == (float *)0x0) {
      fVar18 = (float)pVVar2->pHeap[1];
    }
    else {
      fVar18 = (*pVVar2->pCostsFlt)[pVVar2->pHeap[1]];
    }
    if (fVar18 <= 0.0) break;
    pVVar2 = p_01->vPrio;
    if (pVVar2->nSize < 2) {
      __assert_fail("p->nSize > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xed,"int Vec_QuePop(Vec_Que_t *)");
    }
    piVar3 = pVVar2->pHeap;
    piVar4 = pVVar2->pOrder;
    iVar7 = piVar3[1];
    piVar4[iVar7] = -1;
    fWarning = (int *)(long)pVVar2->nSize;
    iVar16 = pVVar2->nSize + -1;
    pVVar2->nSize = iVar16;
    if (iVar16 == 1) {
      piVar3[1] = -1;
    }
    else {
      iVar16 = piVar3[(long)fWarning + -1];
      piVar3[(long)fWarning + -1] = -1;
      piVar3[1] = iVar16;
      piVar4[iVar16] = 1;
      Vec_QueMoveDown(pVVar2,iVar16);
      fWarning = extraout_RDX;
    }
    if (fVeryVerbose != 0) {
      Fx_PrintDiv(p_01,iVar7);
      fWarning = extraout_RDX_00;
    }
    Fx_ManUpdate(p_01,iVar7,fWarning);
  }
  if (fVerbose != 0) {
    aVar11 = Abc_Clock();
    Fx_PrintStats(p_01,aVar11 - aVar10);
  }
  Fx_ManStop(p_01);
  iVar15 = 0;
  for (iVar7 = 0; iVar16 = vCubes->nSize, iVar8 = iVar15, iVar7 < iVar16; iVar7 = iVar7 + 1) {
    pVVar12 = Vec_WecEntry(vCubes,iVar7);
    if (pVVar12->nSize < 1) {
      if (pVVar12->pArray != (int *)0x0) {
        free(pVVar12->pArray);
        pVVar12->pArray = (int *)0x0;
      }
    }
    else {
      lVar13 = (long)iVar15;
      iVar15 = iVar15 + 1;
      iVar16 = pVVar12->nSize;
      piVar3 = pVVar12->pArray;
      pVVar1 = vCubes->pArray + lVar13;
      pVVar1->nCap = pVVar12->nCap;
      pVVar1->nSize = iVar16;
      pVVar1->pArray = piVar3;
    }
  }
  for (; iVar8 < iVar16; iVar8 = iVar8 + 1) {
    pVVar12 = Vec_WecEntry(vCubes,iVar8);
    pVVar12->nCap = 0;
    pVVar12->nSize = 0;
    pVVar12->pArray = (int *)0x0;
    iVar16 = vCubes->nSize;
  }
  if (iVar16 < iVar15) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0xfa,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = iVar15;
  return 1;
}

Assistant:

int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    int fVeryVeryVerbose = 0;
    int i, iDiv, fWarning = 0;
    Fx_Man_t * p;
    abctime clk = Abc_Clock();
    // initialize the data-structure
    p = Fx_ManStart( vCubes );
    p->LitCountMax = LitCountMax;
    p->fCanonDivs = fCanonDivs;
    Fx_ManCreateLiterals( p, ObjIdMax );
    Fx_ManComputeLevel( p );
    Fx_ManCreateDivisors( p );
    if ( fVeryVerbose )
        Fx_PrintMatrix( p );
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    // perform extraction
    p->timeStart = Abc_Clock();
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vPrio) > 0.0; i++ )
    {
        iDiv = Vec_QuePop(p->vPrio);
        if ( fVeryVerbose )
            Fx_PrintDiv( p, iDiv );
        Fx_ManUpdate( p, iDiv, &fWarning );
        if ( fVeryVeryVerbose )
            Fx_PrintMatrix( p );
    }
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    Fx_ManStop( p );
    // return the result
    Vec_WecRemoveEmpty( vCubes );
    return 1;
}